

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astDataType * datatype_base(Context_conflict *ctx,MOJOSHADER_astDataType *dt)

{
  MOJOSHADER_astDataType *local_20;
  MOJOSHADER_astDataType *dt_local;
  Context_conflict *ctx_local;
  
  local_20 = reduce_datatype(ctx,dt);
  ctx_local = (Context_conflict *)local_20;
  if (local_20 != (MOJOSHADER_astDataType *)0x0) {
    switch(local_20->type) {
    case MOJOSHADER_AST_DATATYPE_ARRAY:
      local_20 = (MOJOSHADER_astDataType *)(local_20->structure).members;
      break;
    case MOJOSHADER_AST_DATATYPE_VECTOR:
      local_20 = (MOJOSHADER_astDataType *)(local_20->structure).members;
      break;
    case MOJOSHADER_AST_DATATYPE_MATRIX:
      local_20 = (MOJOSHADER_astDataType *)(local_20->structure).members;
      break;
    case MOJOSHADER_AST_DATATYPE_BUFFER:
      local_20 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
    ctx_local = (Context_conflict *)&local_20->array;
  }
  return (MOJOSHADER_astDataType *)ctx_local;
}

Assistant:

static const MOJOSHADER_astDataType *datatype_base(Context *ctx, const MOJOSHADER_astDataType *dt)
{
    dt = reduce_datatype(ctx, dt);
    if (dt == NULL)
        return dt;

    switch (dt->type)
    {
        case MOJOSHADER_AST_DATATYPE_VECTOR:
            dt = dt->vector.base;
            break;
        case MOJOSHADER_AST_DATATYPE_MATRIX:
            dt = dt->matrix.base;
            break;
        case MOJOSHADER_AST_DATATYPE_BUFFER:
            dt = dt->buffer.base;
            break;
        case MOJOSHADER_AST_DATATYPE_ARRAY:
            dt = dt->array.base;
            break;
        default: break;
    } // switch

    return dt;
}